

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr,CNetAddr *mask)

{
  byte bVar1;
  Network NVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  uint32_t uVar8;
  long lVar9;
  CNetAddr *pCVar10;
  ulong uVar11;
  uint uVar12;
  size_t sVar13;
  CSubNet *pCVar14;
  long in_FS_OFFSET;
  bool bVar15;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&this->network);
  this->valid = false;
  this->netmask[0] = '\0';
  this->netmask[1] = '\0';
  this->netmask[2] = '\0';
  this->netmask[3] = '\0';
  this->netmask[4] = '\0';
  this->netmask[5] = '\0';
  this->netmask[6] = '\0';
  this->netmask[7] = '\0';
  this->netmask[8] = '\0';
  this->netmask[9] = '\0';
  this->netmask[10] = '\0';
  this->netmask[0xb] = '\0';
  this->netmask[0xc] = '\0';
  this->netmask[0xd] = '\0';
  this->netmask[0xe] = '\0';
  this->netmask[0xf] = '\0';
  NVar2 = addr->m_net;
  if (NVar2 - NET_IPV4 < 2) {
    bVar15 = NVar2 == mask->m_net;
    this->valid = bVar15;
    if (bVar15) {
      uVar3 = (mask->m_addr)._size;
      pCVar10 = mask;
      uVar12 = uVar3;
      if (0x10 < uVar3) {
        pCVar10 = (CNetAddr *)(mask->m_addr)._union.indirect_contents.indirect;
        uVar12 = uVar3 - 0x11;
      }
      if (uVar12 != 0) {
        sVar13 = 0;
        bVar6 = 0;
        do {
          bVar1 = (pCVar10->m_addr)._union.direct[sVar13];
          if (bVar1 < 0xe0) {
            if (bVar1 != 0) {
              if ((bVar1 == 0x80) || (bVar1 == 0xc0)) goto switchD_006d1a2c_caseD_f8;
              goto switchD_006d1a2c_caseD_f9;
            }
            bVar15 = true;
            bVar1 = 0;
            bVar7 = 0;
          }
          else {
            switch(bVar1) {
            case 0xf8:
            case 0xfc:
            case 0xfe:
switchD_006d1a2c_caseD_f8:
              bVar1 = 0;
              break;
            case 0xff:
              bVar7 = 1;
              bVar1 = 0;
              bVar15 = false;
              goto LAB_006d1a5e;
            default:
              if ((bVar1 == 0xe0) || (bVar1 == 0xf0)) goto switchD_006d1a2c_caseD_f8;
            case 0xf9:
            case 0xfa:
            case 0xfb:
            case 0xfd:
switchD_006d1a2c_caseD_f9:
              bVar1 = 1;
            }
            bVar7 = 1;
            bVar15 = true;
          }
LAB_006d1a5e:
          bVar5 = (bool)(bVar7 & bVar6 | bVar1);
          if (bVar5) {
            this->valid = false;
          }
          else if (bVar15) {
            bVar6 = 1;
          }
          if (bVar5) goto LAB_006d1a9b;
          sVar13 = sVar13 + 1;
        } while ((long)(int)uVar12 != sVar13);
      }
      if (0x10 < uVar12) {
        __assert_fail("mask.m_addr.size() <= sizeof(netmask)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                      ,0x3d6,"CSubNet::CSubNet(const CNetAddr &, const CNetAddr &)");
      }
      if (0x10 < uVar3) {
        mask = (CNetAddr *)(mask->m_addr)._union.indirect_contents.indirect;
      }
      memcpy(this->netmask,mask,(long)(int)uVar12);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this,&addr->m_addr);
      uVar8 = addr->m_scope_id;
      (this->network).m_net = addr->m_net;
      (this->network).m_scope_id = uVar8;
      uVar3 = (this->network).m_addr._size;
      bVar15 = uVar3 < 0x11;
      uVar12 = uVar3 - 0x11;
      if (bVar15) {
        uVar12 = uVar3;
      }
      if (uVar12 != 0) {
        lVar9 = 0;
        uVar11 = 0;
        do {
          pCVar14 = this;
          if (!bVar15) {
            pCVar14 = (CSubNet *)(this->network).m_addr._union.indirect_contents.indirect;
          }
          pCVar14->netmask[(lVar9 >> 0x20) + -0x20] =
               pCVar14->netmask[(lVar9 >> 0x20) + -0x20] & this->netmask[uVar11];
          uVar11 = uVar11 + 1;
          uVar3 = (this->network).m_addr._size;
          bVar15 = uVar3 < 0x11;
          uVar12 = uVar3 - 0x11;
          if (bVar15) {
            uVar12 = uVar3;
          }
          lVar9 = lVar9 + 0x100000000;
        } while (uVar11 < uVar12);
      }
    }
  }
  else {
    this->valid = false;
  }
LAB_006d1a9b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr, const CNetAddr& mask) : CSubNet()
{
    valid = (addr.IsIPv4() || addr.IsIPv6()) && addr.m_net == mask.m_net;
    if (!valid) {
        return;
    }
    // Check if `mask` contains 1-bits after 0-bits (which is an invalid netmask).
    bool zeros_found = false;
    for (auto b : mask.m_addr) {
        const int num_bits = NetmaskBits(b);
        if (num_bits == -1 || (zeros_found && num_bits != 0)) {
            valid = false;
            return;
        }
        if (num_bits < 8) {
            zeros_found = true;
        }
    }

    assert(mask.m_addr.size() <= sizeof(netmask));

    memcpy(netmask, mask.m_addr.data(), mask.m_addr.size());

    network = addr;

    // Normalize network according to netmask
    for (size_t x = 0; x < network.m_addr.size(); ++x) {
        network.m_addr[x] &= netmask[x];
    }
}